

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_psbt.cpp
# Opt level: O1

void __thiscall cfdcapi_psbt_GetPsbtOutput_Test::TestBody(cfdcapi_psbt_GetPsbtOutput_Test *this)

{
  bool bVar1;
  uint32_t index;
  char *pcVar2;
  char *in_R9;
  int ret;
  char *value;
  char *fingerprint;
  AssertionResult gtest_ar;
  void *pubkey_list_handle;
  char *signature;
  char *path;
  void *handle;
  void *psbt_handle;
  uint32_t list_num;
  AssertHelper local_b0;
  int local_a4;
  AssertHelper local_a0;
  AssertHelper local_98;
  AssertHelper local_90;
  string local_88;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertHelper local_60;
  AssertHelper local_58;
  void *local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  uint32_t local_34;
  
  local_50 = (void *)0x0;
  local_a4 = CfdCreateHandle(&local_50);
  local_48.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_48.ptr_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_88,"kCfdSuccess","ret",(CfdErrorCode *)&local_48,&local_a4);
  if ((char)local_88._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_88._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x4ae,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.ptr_._0_1_ = local_50 != (void *)0x0;
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_50 == (void *)0x0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_88,(internal *)&local_48,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x4af,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                       (char)local_88._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p) !=
        &local_88.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p));
    }
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
      local_60.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pcVar2 = "";
  local_a4 = CfdCreatePsbtHandle(local_50,1,
                                 "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQAiACA8rQYZ3mfmJHp2oQKBNjXAU0V8a6T95Kwf/YFI1w5LzAEBR1IhApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7IQJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQlKuIgICYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkIYnWtthiwAAIAAAACAAAAAgAAAAAAMAAAAIgICkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnsYKnBHYCwAAIAAAACAAAAAgAAAAAAMAAAAAA=="
                                 ,"",0,0,&local_48.ptr_);
  local_60.data_ = local_60.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_88,"kCfdSuccess","ret",(CfdErrorCode *)&local_60,&local_a4);
  if ((char)local_88._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_60);
    if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
      pcVar2 = *(char **)local_88._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x4b6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
      local_60.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_a4 == 0) {
    local_a4 = CfdIsFindPsbtPubkeyRecord
                         (local_50,local_48.ptr_,3,0,
                          "02622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242");
    local_60.data_ = local_60.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_88,"kCfdSuccess","ret",(CfdErrorCode *)&local_60,&local_a4);
    if ((char)local_88._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_60);
      if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_88._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x4ba,pcVar2);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if (local_60.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_60.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_60.data_ + 8))();
        }
        local_60.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_88._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_60.data_ = (AssertHelperData *)0x0;
    local_a4 = CfdGetPsbtPubkeyRecord
                         (local_50,local_48.ptr_,3,0,
                          "02622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242",
                          (char **)&local_60);
    local_90.data_ = (AssertHelperData *)((ulong)local_90.data_._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_88,"kCfdSuccess","ret",(CfdErrorCode *)&local_90,&local_a4);
    if ((char)local_88._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_90);
      if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_88._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x4bf,pcVar2);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_90.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_90.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_90.data_ + 8))();
        }
        local_90.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_88._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_a4 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_88,"\"9d6b6d862c0000800000008000000080000000000c000000\"",
                 "signature","9d6b6d862c0000800000008000000080000000000c000000",
                 (char *)local_60.data_);
      if ((char)local_88._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_90);
        if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_88._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x4c1,pcVar2);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (local_90.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_90.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_90.data_ + 8))();
          }
          local_90.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_88._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_a4 = CfdFreeStringBuffer((char *)local_60.data_);
      local_90.data_ = local_90.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_88,"kCfdSuccess","ret",(CfdErrorCode *)&local_90,&local_a4);
      if ((char)local_88._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_90);
        if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_88._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x4c3,pcVar2);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (local_90.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_90.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_90.data_ + 8))();
          }
          local_90.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_88._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    local_90.data_ = (AssertHelperData *)0x0;
    local_58.data_ = (AssertHelperData *)0x0;
    local_a4 = CfdGetPsbtBip32Data(local_50,local_48.ptr_,3,0,
                                   "02622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242"
                                   ,(char **)&local_90,(char **)&local_58);
    local_68.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((ulong)local_68.ptr_._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_88,"kCfdSuccess","ret",(CfdErrorCode *)&local_68,&local_a4);
    if ((char)local_88._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_68);
      if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_88._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x4c9,pcVar2);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_68.ptr_ + 8))();
        }
        local_68.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_88._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_a4 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_88,"\"9d6b6d86\"","fingerprint","9d6b6d86",
                 (char *)local_90.data_);
      if ((char)local_88._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_68);
        if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_88._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x4cb,pcVar2);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_68.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_68.ptr_ + 8))();
          }
          local_68.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_88._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_88,"\"44\'/0\'/0\'/0/12\"","path","44\'/0\'/0\'/0/12",
                 (char *)local_58.data_);
      if ((char)local_88._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_68);
        if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_88._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x4cc,pcVar2);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_68.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_68.ptr_ + 8))();
          }
          local_68.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_88._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_a4 = CfdFreeStringBuffer((char *)local_90.data_);
      local_68.ptr_ = local_68.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_88,"kCfdSuccess","ret",(CfdErrorCode *)&local_68,&local_a4);
      if ((char)local_88._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_68);
        if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_88._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x4ce,pcVar2);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_68.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_68.ptr_ + 8))();
          }
          local_68.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_88._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_a4 = CfdFreeStringBuffer((char *)local_58.data_);
      local_68.ptr_ = local_68.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_88,"kCfdSuccess","ret",(CfdErrorCode *)&local_68,&local_a4);
      if ((char)local_88._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_68);
        if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_88._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x4d0,pcVar2);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_68.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_68.ptr_ + 8))();
          }
          local_68.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_88._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    local_68.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_34 = 0;
    local_a4 = CfdGetPsbtPubkeyList(local_50,local_48.ptr_,3,0,&local_34,&local_68.ptr_);
    local_98.data_ = (AssertHelperData *)((ulong)local_98.data_._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_88,"kCfdSuccess","ret",(CfdErrorCode *)&local_98,&local_a4);
    if ((char)local_88._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_98);
      if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_88._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x4d6,pcVar2);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      if (local_98.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_98.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_98.data_ + 8))();
        }
        local_98.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_88._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_98.data_._0_4_ = 2;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              ((internal *)&local_88,"2","list_num",(int *)&local_98,&local_34);
    if ((char)local_88._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_98);
      if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_88._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x4d7,pcVar2);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      if (local_98.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_98.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_98.data_ + 8))();
        }
        local_98.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_88._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_a4 == 0) {
      index = 0;
      local_98.data_ = (AssertHelperData *)0x0;
      local_90.data_ = (AssertHelperData *)0x0;
      local_58.data_ = (AssertHelperData *)0x0;
      if (local_34 != 0) {
        do {
          local_a4 = CfdGetPsbtPubkeyListData
                               (local_50,local_68.ptr_,index,(char **)&local_98,(char **)0x0);
          local_b0.data_ = local_b0.data_ & 0xffffffff00000000;
          testing::internal::CmpHelperEQ<CfdErrorCode,int>
                    ((internal *)&local_88,"kCfdSuccess","ret",(CfdErrorCode *)&local_b0,&local_a4);
          if ((char)local_88._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_b0);
            pcVar2 = "";
            if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
              pcVar2 = *(char **)local_88._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_a0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x4de,pcVar2);
            testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
            testing::internal::AssertHelper::~AssertHelper(&local_a0);
            if (local_b0.data_ != (AssertHelperData *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_b0.data_ + 8))();
              }
              local_b0.data_ = (AssertHelperData *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_88._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          if (local_a4 == 0) {
            if (index == 1) {
              testing::internal::CmpHelperSTREQ
                        ((internal *)&local_88,
                         "\"02906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b\"",
                         "pk","02906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b",
                         (char *)local_98.data_);
              if ((char)local_88._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_b0);
                pcVar2 = "";
                if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
                  pcVar2 = *(char **)local_88._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_a0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                           ,0x4e3,pcVar2);
                testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
                testing::internal::AssertHelper::~AssertHelper(&local_a0);
                if (local_b0.data_ != (AssertHelperData *)0x0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
                    (**(code **)(*(long *)local_b0.data_ + 8))();
                  }
                  local_b0.data_ = (AssertHelperData *)0x0;
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_88._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            else if (index == 0) {
              testing::internal::CmpHelperSTREQ
                        ((internal *)&local_88,
                         "\"02622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242\"",
                         "pk","02622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242",
                         (char *)local_98.data_);
              if ((char)local_88._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_b0);
                pcVar2 = "";
                if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
                  pcVar2 = *(char **)local_88._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_a0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                           ,0x4e1,pcVar2);
                testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
                testing::internal::AssertHelper::~AssertHelper(&local_a0);
                if (local_b0.data_ != (AssertHelperData *)0x0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
                    (**(code **)(*(long *)local_b0.data_ + 8))();
                  }
                  local_b0.data_ = (AssertHelperData *)0x0;
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_88._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            local_a4 = CfdFreeStringBuffer((char *)local_98.data_);
            local_b0.data_ = local_b0.data_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&local_88,"kCfdSuccess","ret",(CfdErrorCode *)&local_b0,&local_a4
                      );
            if ((char)local_88._M_dataplus._M_p == '\0') {
              testing::Message::Message((Message *)&local_b0);
              pcVar2 = "";
              if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
                pcVar2 = *(char **)local_88._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_a0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x4e6,pcVar2);
              testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
              testing::internal::AssertHelper::~AssertHelper(&local_a0);
              if (local_b0.data_ != (AssertHelperData *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_b0.data_ + 8))();
                }
                local_b0.data_ = (AssertHelperData *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_88._M_string_length,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_98.data_ = (AssertHelperData *)0x0;
          }
          local_a4 = CfdGetPsbtPubkeyListBip32Data
                               (local_50,local_68.ptr_,index,(char **)&local_98,(char **)&local_90,
                                (char **)&local_58);
          local_b0.data_ = local_b0.data_ & 0xffffffff00000000;
          testing::internal::CmpHelperEQ<CfdErrorCode,int>
                    ((internal *)&local_88,"kCfdSuccess","ret",(CfdErrorCode *)&local_b0,&local_a4);
          if ((char)local_88._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_b0);
            pcVar2 = "";
            if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
              pcVar2 = *(char **)local_88._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_a0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x4ea,pcVar2);
            testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
            testing::internal::AssertHelper::~AssertHelper(&local_a0);
            if (local_b0.data_ != (AssertHelperData *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_b0.data_ + 8))();
              }
              local_b0.data_ = (AssertHelperData *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_88._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          CfdcapiPsbtDumpLog(local_a4,local_50);
          if (local_a4 == 0) {
            if (index == 1) {
              testing::internal::CmpHelperSTREQ
                        ((internal *)&local_88,
                         "\"02906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b\"",
                         "pk","02906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b",
                         (char *)local_98.data_);
              if ((char)local_88._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_b0);
                pcVar2 = "";
                if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
                  pcVar2 = *(char **)local_88._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_a0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                           ,0x4f2,pcVar2);
                testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
                testing::internal::AssertHelper::~AssertHelper(&local_a0);
                if (local_b0.data_ != (AssertHelperData *)0x0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
                    (**(code **)(*(long *)local_b0.data_ + 8))();
                  }
                  local_b0.data_ = (AssertHelperData *)0x0;
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_88._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              testing::internal::CmpHelperSTREQ
                        ((internal *)&local_88,"\"2a704760\"","fingerprint","2a704760",
                         (char *)local_90.data_);
              if ((char)local_88._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_b0);
                pcVar2 = "";
                if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
                  pcVar2 = *(char **)local_88._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_a0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                           ,0x4f3,pcVar2);
                testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
                testing::internal::AssertHelper::~AssertHelper(&local_a0);
                if (local_b0.data_ != (AssertHelperData *)0x0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
                    (**(code **)(*(long *)local_b0.data_ + 8))();
                  }
                  local_b0.data_ = (AssertHelperData *)0x0;
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_88._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              testing::internal::CmpHelperSTREQ
                        ((internal *)&local_88,"\"44\'/0\'/0\'/0/12\"","path","44\'/0\'/0\'/0/12",
                         (char *)local_58.data_);
              if ((char)local_88._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_b0);
                pcVar2 = "";
                if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
                  pcVar2 = *(char **)local_88._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_a0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                           ,0x4f4,pcVar2);
                testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
                testing::internal::AssertHelper::~AssertHelper(&local_a0);
                if (local_b0.data_ != (AssertHelperData *)0x0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
                    (**(code **)(*(long *)local_b0.data_ + 8))();
                  }
                  local_b0.data_ = (AssertHelperData *)0x0;
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_88._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            else if (index == 0) {
              testing::internal::CmpHelperSTREQ
                        ((internal *)&local_88,
                         "\"02622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242\"",
                         "pk","02622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242",
                         (char *)local_98.data_);
              if ((char)local_88._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_b0);
                pcVar2 = "";
                if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
                  pcVar2 = *(char **)local_88._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_a0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                           ,0x4ee,pcVar2);
                testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
                testing::internal::AssertHelper::~AssertHelper(&local_a0);
                if (local_b0.data_ != (AssertHelperData *)0x0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
                    (**(code **)(*(long *)local_b0.data_ + 8))();
                  }
                  local_b0.data_ = (AssertHelperData *)0x0;
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_88._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              testing::internal::CmpHelperSTREQ
                        ((internal *)&local_88,"\"9d6b6d86\"","fingerprint","9d6b6d86",
                         (char *)local_90.data_);
              if ((char)local_88._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_b0);
                pcVar2 = "";
                if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
                  pcVar2 = *(char **)local_88._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_a0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                           ,0x4ef,pcVar2);
                testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
                testing::internal::AssertHelper::~AssertHelper(&local_a0);
                if (local_b0.data_ != (AssertHelperData *)0x0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
                    (**(code **)(*(long *)local_b0.data_ + 8))();
                  }
                  local_b0.data_ = (AssertHelperData *)0x0;
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_88._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              testing::internal::CmpHelperSTREQ
                        ((internal *)&local_88,"\"44\'/0\'/0\'/0/12\"","path","44\'/0\'/0\'/0/12",
                         (char *)local_58.data_);
              if ((char)local_88._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_b0);
                pcVar2 = "";
                if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
                  pcVar2 = *(char **)local_88._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_a0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                           ,0x4f0,pcVar2);
                testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
                testing::internal::AssertHelper::~AssertHelper(&local_a0);
                if (local_b0.data_ != (AssertHelperData *)0x0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
                    (**(code **)(*(long *)local_b0.data_ + 8))();
                  }
                  local_b0.data_ = (AssertHelperData *)0x0;
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_88._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            local_a4 = CfdFreeStringBuffer((char *)local_98.data_);
            local_b0.data_ = local_b0.data_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&local_88,"kCfdSuccess","ret",(CfdErrorCode *)&local_b0,&local_a4
                      );
            if ((char)local_88._M_dataplus._M_p == '\0') {
              testing::Message::Message((Message *)&local_b0);
              pcVar2 = "";
              if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
                pcVar2 = *(char **)local_88._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_a0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x4f7,pcVar2);
              testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
              testing::internal::AssertHelper::~AssertHelper(&local_a0);
              if (local_b0.data_ != (AssertHelperData *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_b0.data_ + 8))();
                }
                local_b0.data_ = (AssertHelperData *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_88._M_string_length,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_98.data_ = (AssertHelperData *)0x0;
            local_a4 = CfdFreeStringBuffer((char *)local_90.data_);
            local_b0.data_ = local_b0.data_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&local_88,"kCfdSuccess","ret",(CfdErrorCode *)&local_b0,&local_a4
                      );
            if ((char)local_88._M_dataplus._M_p == '\0') {
              testing::Message::Message((Message *)&local_b0);
              pcVar2 = "";
              if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
                pcVar2 = *(char **)local_88._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_a0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x4fa,pcVar2);
              testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
              testing::internal::AssertHelper::~AssertHelper(&local_a0);
              if (local_b0.data_ != (AssertHelperData *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_b0.data_ + 8))();
                }
                local_b0.data_ = (AssertHelperData *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_88._M_string_length,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_90.data_ = (AssertHelperData *)0x0;
            local_a4 = CfdFreeStringBuffer((char *)local_58.data_);
            local_b0.data_ = local_b0.data_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&local_88,"kCfdSuccess","ret",(CfdErrorCode *)&local_b0,&local_a4
                      );
            if ((char)local_88._M_dataplus._M_p == '\0') {
              testing::Message::Message((Message *)&local_b0);
              pcVar2 = "";
              if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
                pcVar2 = *(char **)local_88._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_a0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x4fd,pcVar2);
              testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
              testing::internal::AssertHelper::~AssertHelper(&local_a0);
              if (local_b0.data_ != (AssertHelperData *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_b0.data_ + 8))();
                }
                local_b0.data_ = (AssertHelperData *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_88._M_string_length,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_58.data_ = (AssertHelperData *)0x0;
          }
          index = index + 1;
        } while (index < local_34);
      }
      local_a4 = CfdFreePsbtPubkeyList(local_50,local_68.ptr_);
      local_b0.data_ = local_b0.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_88,"kCfdSuccess","ret",(CfdErrorCode *)&local_b0,&local_a4);
      if ((char)local_88._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_b0);
        if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_88._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x502,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if (local_b0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_b0.data_ + 8))();
          }
          local_b0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_88._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    local_98.data_ = (AssertHelperData *)0x0;
    local_a4 = CfdGetPsbtRecord(local_50,local_48.ptr_,3,0,"01",(char **)&local_98);
    local_b0.data_ = local_b0.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_88,"kCfdSuccess","ret",(CfdErrorCode *)&local_b0,&local_a4);
    if ((char)local_88._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_b0);
      if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_88._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x507,pcVar2);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_b0.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_b0.data_ + 8))();
        }
        local_b0.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_88._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_a4 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_88,
                 "\"522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae\""
                 ,"value",
                 "522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae"
                 ,(char *)local_98.data_);
      if ((char)local_88._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_b0);
        if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_88._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x509,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if (local_b0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_b0.data_ + 8))();
          }
          local_b0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_88._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_a4 = CfdFreeStringBuffer((char *)local_98.data_);
      local_b0.data_ = local_b0.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_88,"kCfdSuccess","ret",(CfdErrorCode *)&local_b0,&local_a4);
      if ((char)local_88._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_b0);
        if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_88._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x50c,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if (local_b0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_b0.data_ + 8))();
          }
          local_b0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_88._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_98.data_ = (AssertHelperData *)0x0;
    }
    local_a4 = CfdIsFindPsbtRecord(local_50,local_48.ptr_,3,0,"98");
    local_b0.data_._0_4_ = 8;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_88,"kCfdNotFoundError","ret",(CfdErrorCode *)&local_b0,&local_a4);
    if ((char)local_88._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_b0);
      if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_88._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x513,pcVar2);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_b0.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_b0.data_ + 8))();
        }
        local_b0.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_88._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_a4 = CfdAddPsbtRecord(local_50,local_48.ptr_,3,0,"98","0011223355");
    local_b0.data_ = local_b0.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_88,"kCfdSuccess","ret",(CfdErrorCode *)&local_b0,&local_a4);
    if ((char)local_88._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_b0);
      if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_88._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x516,pcVar2);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_b0.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_b0.data_ + 8))();
        }
        local_b0.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_88._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_a4 = CfdIsFindPsbtRecord(local_50,local_48.ptr_,3,0,"98");
    local_b0.data_ = local_b0.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_88,"kCfdSuccess","ret",(CfdErrorCode *)&local_b0,&local_a4);
    if ((char)local_88._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_b0);
      if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_88._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x519,pcVar2);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_b0.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_b0.data_ + 8))();
        }
        local_b0.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_88._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_98.data_ = (AssertHelperData *)0x0;
    local_a4 = CfdGetPsbtRecord(local_50,local_48.ptr_,3,0,"98",(char **)&local_98);
    local_b0.data_ = local_b0.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_88,"kCfdSuccess","ret",(CfdErrorCode *)&local_b0,&local_a4);
    if ((char)local_88._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_b0);
      if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_88._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x51d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_b0.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_b0.data_ + 8))();
        }
        local_b0.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_88._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_a4 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_88,"exp_unknown_value","value","0011223355",
                 (char *)local_98.data_);
      if ((char)local_88._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_b0);
        if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_88._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x51f,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if (local_b0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_b0.data_ + 8))();
          }
          local_b0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_88._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_a4 = CfdFreeStringBuffer((char *)local_98.data_);
      local_b0.data_ = local_b0.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_88,"kCfdSuccess","ret",(CfdErrorCode *)&local_b0,&local_a4);
      if ((char)local_88._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_b0);
        if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_88._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x522,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if (local_b0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_b0.data_ + 8))();
          }
          local_b0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_88._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_98.data_ = (AssertHelperData *)0x0;
    }
    local_a4 = CfdFreePsbtHandle(local_50,local_48.ptr_);
    local_b0.data_ = local_b0.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_88,"kCfdSuccess","ret",(CfdErrorCode *)&local_b0,&local_a4);
    if ((char)local_88._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_b0);
      if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_88._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x527,pcVar2);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_b0.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_b0.data_ + 8))();
        }
        local_b0.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_88._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  local_a4 = CfdFreeHandle(local_50);
  local_60.data_ = local_60.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_88,"kCfdSuccess","ret",(CfdErrorCode *)&local_60,&local_a4);
  if ((char)local_88._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_60);
    if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_88._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x52b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
      local_60.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cfdcapi_psbt, GetPsbtOutput) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int net_type = kCfdNetworkTestnet;
  void* psbt_handle = nullptr;
  const char* psbt_base64 = "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQAiACA8rQYZ3mfmJHp2oQKBNjXAU0V8a6T95Kwf/YFI1w5LzAEBR1IhApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7IQJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQlKuIgICYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkIYnWtthiwAAIAAAACAAAAAgAAAAAAMAAAAIgICkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnsYKnBHYCwAAIAAAACAAAAAgAAAAAAMAAAAAA==";
  ret = CfdCreatePsbtHandle(
    handle, net_type, psbt_base64, "", 0, 0, &psbt_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    const char* pubkey = "02622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242";
    ret = CfdIsFindPsbtPubkeyRecord(handle, psbt_handle, kCfdPsbtRecordOutputBip32, 0, pubkey);
    EXPECT_EQ(kCfdSuccess, ret);

    char* signature = nullptr;
    ret = CfdGetPsbtPubkeyRecord(handle, psbt_handle,
        kCfdPsbtRecordOutputBip32, 0, pubkey, &signature);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("9d6b6d862c0000800000008000000080000000000c000000", signature);
      ret = CfdFreeStringBuffer(signature);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    char* fingerprint = nullptr;
    char* path = nullptr;
    ret = CfdGetPsbtBip32Data(handle, psbt_handle, kCfdPsbtRecordOutputBip32, 0, pubkey, &fingerprint, &path);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("9d6b6d86", fingerprint);
      EXPECT_STREQ("44'/0'/0'/0/12", path);
      ret = CfdFreeStringBuffer(fingerprint);
      EXPECT_EQ(kCfdSuccess, ret);
      ret = CfdFreeStringBuffer(path);
      EXPECT_EQ(kCfdSuccess, ret);
    }
    void* pubkey_list_handle = nullptr;
    uint32_t list_num = 0;
    ret = CfdGetPsbtPubkeyList(handle, psbt_handle, kCfdPsbtRecordOutputBip32,
        0, &list_num, &pubkey_list_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(2, list_num);
    if (ret == kCfdSuccess) {
      char* pk = nullptr;
      fingerprint = nullptr;
      path = nullptr;
      for (uint32_t index=0; index<list_num; ++index) {
        ret = CfdGetPsbtPubkeyListData(handle, pubkey_list_handle, index, &pk, nullptr);
        EXPECT_EQ(kCfdSuccess, ret);
        if (ret == kCfdSuccess) {
          if (index == 0) {
            EXPECT_STREQ("02622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242", pk);
          } else if (index == 1) {
            EXPECT_STREQ("02906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b", pk);
          }
          ret = CfdFreeStringBuffer(pk);
          EXPECT_EQ(kCfdSuccess, ret);
          pk = nullptr;
        }
        ret = CfdGetPsbtPubkeyListBip32Data(handle, pubkey_list_handle, index, &pk, &fingerprint, &path);
        EXPECT_EQ(kCfdSuccess, ret);
        CfdcapiPsbtDumpLog(ret, handle);
        if (ret == kCfdSuccess) {
          if (index == 0) {
            EXPECT_STREQ("02622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242", pk);
            EXPECT_STREQ("9d6b6d86", fingerprint);
            EXPECT_STREQ("44'/0'/0'/0/12", path);
          } else if (index == 1) {
            EXPECT_STREQ("02906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b", pk);
            EXPECT_STREQ("2a704760", fingerprint);
            EXPECT_STREQ("44'/0'/0'/0/12", path);
          }
          ret = CfdFreeStringBuffer(pk);
          EXPECT_EQ(kCfdSuccess, ret);
          pk = nullptr;
          ret = CfdFreeStringBuffer(fingerprint);
          EXPECT_EQ(kCfdSuccess, ret);
          fingerprint = nullptr;
          ret = CfdFreeStringBuffer(path);
          EXPECT_EQ(kCfdSuccess, ret);
          path = nullptr;
        }
      }
      ret = CfdFreePsbtPubkeyList(handle, pubkey_list_handle);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    char* value = nullptr;
    ret = CfdGetPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeOutput, 0, "01", &value);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae", value);

      ret = CfdFreeStringBuffer(value);
      EXPECT_EQ(kCfdSuccess, ret);
      value = nullptr;
    }

    const char* unknown_key = "98";
    const char* exp_unknown_value = "0011223355";
    ret = CfdIsFindPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeOutput, 0, unknown_key);
    EXPECT_EQ(kCfdNotFoundError, ret);

    ret = CfdAddPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeOutput, 0, unknown_key, exp_unknown_value);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdIsFindPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeOutput, 0, unknown_key);
    EXPECT_EQ(kCfdSuccess, ret);

    value = nullptr;
    ret = CfdGetPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeOutput, 0, unknown_key, &value);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(exp_unknown_value, value);

      ret = CfdFreeStringBuffer(value);
      EXPECT_EQ(kCfdSuccess, ret);
      value = nullptr;
    }

    ret = CfdFreePsbtHandle(handle, psbt_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}